

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O1

void __thiscall FIX::FileLog::backup(FileLog *this)

{
  char *pcVar1;
  ostream *poVar2;
  FILE *file;
  FILE *file_00;
  int iVar3;
  stringstream messagesFileName;
  stringstream eventFileName;
  long *local_380;
  long local_370 [2];
  ofstream *local_360;
  ofstream *local_358;
  ios_base *local_350;
  ios_base *local_348;
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  local_358 = &this->m_messages;
  std::ofstream::close();
  local_360 = &this->m_event;
  std::ofstream::close();
  local_350 = aiStack_138;
  local_348 = aiStack_2c0;
  iVar3 = 1;
  do {
    std::__cxx11::stringstream::stringstream(local_340);
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_330,(this->m_fullBackupPrefix)._M_dataplus._M_p,
                        (this->m_fullBackupPrefix)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"messages.backup.",0x10);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".log",4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(this->m_fullBackupPrefix)._M_dataplus._M_p,
                        (this->m_fullBackupPrefix)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"event.backup.",0xd);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".log",4);
    std::__cxx11::stringbuf::str();
    file = file_fopen((char *)local_380,"r");
    if (local_380 != local_370) {
      operator_delete(local_380,local_370[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    file_00 = file_fopen((char *)local_380,"r");
    if (local_380 != local_370) {
      operator_delete(local_380,local_370[0] + 1);
    }
    if (file == (FILE *)0x0 && file_00 == (FILE *)0x0) {
      pcVar1 = (this->m_messagesFileName)._M_dataplus._M_p;
      std::__cxx11::stringbuf::str();
      file_rename(pcVar1,(char *)local_380);
      if (local_380 != local_370) {
        operator_delete(local_380,local_370[0] + 1);
      }
      pcVar1 = (this->m_eventFileName)._M_dataplus._M_p;
      std::__cxx11::stringbuf::str();
      file_rename(pcVar1,(char *)local_380);
      if (local_380 != local_370) {
        operator_delete(local_380,local_370[0] + 1);
      }
      std::ofstream::open((char *)local_358,
                          (_Ios_Openmode)(this->m_messagesFileName)._M_dataplus._M_p);
      std::ofstream::open((char *)local_360,(_Ios_Openmode)(this->m_eventFileName)._M_dataplus._M_p)
      ;
    }
    else {
      if (file != (FILE *)0x0) {
        file_fclose(file);
      }
      if (file_00 != (FILE *)0x0) {
        file_fclose(file_00);
      }
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_350);
    std::__cxx11::stringstream::~stringstream(local_340);
    std::ios_base::~ios_base(local_348);
    iVar3 = iVar3 + 1;
  } while (file != (FILE *)0x0 || file_00 != (FILE *)0x0);
  return;
}

Assistant:

void FileLog::backup()
{
  m_messages.close();
  m_event.close();

  int i = 0;
  while( true )
  {
    std::stringstream messagesFileName;
    std::stringstream eventFileName;

    messagesFileName << m_fullBackupPrefix << "messages.backup." << ++i << ".log";
    eventFileName << m_fullBackupPrefix << "event.backup." << i << ".log";
    FILE* messagesLogFile = file_fopen( messagesFileName.str().c_str(), "r" );
    FILE* eventLogFile = file_fopen( eventFileName.str().c_str(), "r" );

    if( messagesLogFile == NULL && eventLogFile == NULL )
    {
      file_rename( m_messagesFileName.c_str(), messagesFileName.str().c_str() );
      file_rename( m_eventFileName.c_str(), eventFileName.str().c_str() );
      m_messages.open( m_messagesFileName.c_str(), std::ios::out | std::ios::trunc );
      m_event.open( m_eventFileName.c_str(), std::ios::out | std::ios::trunc );
      return;
    }

    if( messagesLogFile != NULL ) file_fclose( messagesLogFile );
    if( eventLogFile != NULL ) file_fclose( eventLogFile );
  }
}